

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O3

void Cnf_CutAssignAreaFlow(Cnf_Man_t *p,Dar_Cut_t *pCut,int *pAreaFlows)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = *(uint *)&pCut->field_0x4;
  *(uint *)&pCut->field_0x4 = uVar4 & 0xf800ffff;
  uVar6 = ((int)p->pSopSizes[(ulong)uVar4 & 0xffff ^ 0xffff] +
          (int)p->pSopSizes[(ulong)uVar4 & 0xffff]) * 10;
  pCut->uSign = uVar6;
  if (0x1fffffff < uVar4) {
    uVar7 = 0;
    uVar4 = uVar4 & 0xf800ffff;
    do {
      pVVar1 = p->pManAig->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar2 = (void *)0x0;
      }
      else {
        uVar5 = pCut->pLeaves[uVar7];
        if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = pVVar1->pArray[uVar5];
      }
      uVar3 = uVar4 & 0xf800ffff |
              (*(uint *)((long)pvVar2 + 0x18) & 0x1ffc0) * 0x400 + uVar4 & 0x7ff0000;
      *(uint *)&pCut->field_0x4 = uVar3;
      uVar5 = *(uint *)((long)pvVar2 + 0x18);
      if (0xfffffffd < (uVar5 & 7) - 7) {
        if (uVar5 < 0x40) {
          __assert_fail("pLeaf->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfMap.c"
                        ,0x39,"void Cnf_CutAssignAreaFlow(Cnf_Man_t *, Dar_Cut_t *, int *)");
        }
        uVar6 = uVar6 + pAreaFlows[*(int *)((long)pvVar2 + 0x24)] / (int)(uVar5 >> 6);
        pCut->uSign = uVar6;
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar4 >> 0x1d;
      uVar4 = uVar3;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area flow of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CutAssignAreaFlow( Cnf_Man_t * p, Dar_Cut_t * pCut, int * pAreaFlows )
{
    Aig_Obj_t * pLeaf;
    int i;
    pCut->Value = 0;
//    pCut->uSign = 100 * Cnf_CutSopCost( p, pCut );
    pCut->uSign = 10 * Cnf_CutSopCost( p, pCut );
    Dar_CutForEachLeaf( p->pManAig, pCut, pLeaf, i )
    {
        pCut->Value += pLeaf->nRefs;
        if ( !Aig_ObjIsNode(pLeaf) )
            continue;
        assert( pLeaf->nRefs > 0 );
        pCut->uSign += pAreaFlows[pLeaf->Id] / (pLeaf->nRefs? pLeaf->nRefs : 1);
    }
}